

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::DataTable
          (DataTable *this,ClientContext *context,DataTable *parent,BoundConstraint *constraint)

{
  shared_ptr<duckdb::DataTableInfo,_true> *this_00;
  mutex *__mutex;
  pointer pIVar1;
  pointer pCVar2;
  DataTableInfo *pDVar3;
  LocalStorage *this_01;
  pthread_mutex_t *this_02;
  pointer name;
  pointer this_03;
  pthread_mutex_t local_108 [5];
  
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::DataTable>).__weak_this_.internal.
  super___weak_ptr<duckdb::DataTable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->db = parent->db;
  this_00 = &this->info;
  ::std::__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             (__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)&parent->info);
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->append_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->append_lock).super___mutex_base._M_mutex.__align = 0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_definitions).
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::__shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2> *)
             &this->row_groups,
             (__shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2> *)
             &parent->row_groups);
  (this->version)._M_i = MAIN_TABLE;
  pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&parent->info);
  pIVar1 = (pDVar3->index_storage_infos).
           super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
           super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (name = (pDVar3->index_storage_infos).
              super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
              super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>
              ._M_impl.super__Vector_impl_data._M_start; name != pIVar1; name = name + 1) {
    pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
    IndexStorageInfo::IndexStorageInfo((IndexStorageInfo *)&local_108[0].__data,&name->name);
    ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::
    emplace_back<duckdb::IndexStorageInfo>
              (&(pDVar3->index_storage_infos).
                super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>,
               (IndexStorageInfo *)&local_108[0].__data);
    IndexStorageInfo::~IndexStorageInfo((IndexStorageInfo *)&local_108[0].__data);
  }
  pDVar3 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_00);
  DataTableInfo::InitializeIndexes(pDVar3,context,(char *)0x0);
  this_01 = LocalStorage::Get(context,this->db);
  __mutex = &parent->append_lock;
  this_02 = (pthread_mutex_t *)__mutex;
  ::std::mutex::lock(__mutex);
  pCVar2 = (parent->column_definitions).
           super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (this_03 = (parent->column_definitions).
                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_03 != pCVar2; this_03 = this_03 + 1
      ) {
    ColumnDefinition::Copy((ColumnDefinition *)&local_108[0].__data,this_03);
    ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::
    emplace_back<duckdb::ColumnDefinition>
              (&(this->column_definitions).
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>,
               (ColumnDefinition *)&local_108[0].__data);
    this_02 = local_108;
    ColumnDefinition::~ColumnDefinition((ColumnDefinition *)&local_108[0].__data);
  }
  if (constraint->type != UNIQUE) {
    VerifyNewConstraint((DataTable *)&this_02->__data,this_01,parent,constraint);
  }
  LocalStorage::MoveStorage(this_01,parent,this);
  LOCK();
  (parent->version)._M_i = ALTERED;
  UNLOCK();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

DataTable::DataTable(ClientContext &context, DataTable &parent, BoundConstraint &constraint)
    : db(parent.db), info(parent.info), row_groups(parent.row_groups), version(DataTableVersion::MAIN_TABLE) {

	// ALTER COLUMN to add a new constraint.

	// Clone the storage info vector or the table.
	for (const auto &index_info : parent.info->index_storage_infos) {
		info->index_storage_infos.push_back(IndexStorageInfo(index_info.name));
	}
	info->InitializeIndexes(context);

	auto &local_storage = LocalStorage::Get(context, db);
	lock_guard<mutex> parent_lock(parent.append_lock);
	for (auto &column_def : parent.column_definitions) {
		column_definitions.emplace_back(column_def.Copy());
	}

	if (constraint.type != ConstraintType::UNIQUE) {
		VerifyNewConstraint(local_storage, parent, constraint);
	}
	local_storage.MoveStorage(parent, *this);
	parent.version = DataTableVersion::ALTERED;
}